

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O0

int Gia_ManSatokoCallOne(Gia_Man_t *p,satoko_opts_t *opts,int iOutput)

{
  abctime aVar1;
  satoko_t *s;
  satoko_stats_t *psVar2;
  abctime aVar3;
  int local_38;
  int local_34;
  int Cost;
  int status;
  satoko_t *pSat;
  abctime clk;
  int iOutput_local;
  satoko_opts_t *opts_local;
  Gia_Man_t *p_local;
  
  aVar1 = Abc_Clock();
  local_34 = -1;
  local_38 = 0;
  s = Gia_ManSatokoCreate(p,opts);
  if (s != (satoko_t *)0x0) {
    local_34 = satoko_solve(s);
    psVar2 = satoko_stats(s);
    local_38 = (int)psVar2->n_conflicts;
    satoko_destroy(s);
  }
  aVar3 = Abc_Clock();
  Gia_ManSatokoReport(iOutput,local_34,aVar3 - aVar1);
  return local_38;
}

Assistant:

int Gia_ManSatokoCallOne( Gia_Man_t * p, satoko_opts_t * opts, int iOutput )
{
    abctime clk = Abc_Clock();
    satoko_t * pSat;
    int status = SATOKO_UNSAT, Cost = 0;
    pSat = Gia_ManSatokoCreate( p, opts );
    if ( pSat )
    {
        status = satoko_solve( pSat );
        Cost = satoko_stats(pSat)->n_conflicts;
        satoko_destroy( pSat );
    }
    Gia_ManSatokoReport( iOutput, status, Abc_Clock() - clk );
    return Cost;
}